

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O0

int32_t uloc_getDisplayKeywordValue_63
                  (char *locale,char *keyword,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UResourceBundle *resB_01;
  UChar *src;
  UResourceBundle *currency;
  UResourceBundle *currencies;
  UResourceBundle *bundle;
  UChar *dispName;
  int32_t local_2c0;
  int32_t dispNameLen;
  int32_t keywordValueLen;
  int32_t capacity;
  char keywordValue [628];
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *displayLocale_local;
  char *keyword_local;
  char *locale_local;
  
  dispNameLen = 0x274;
  local_2c0 = 0;
  if ((status == (UErrorCode *)0x0) ||
     (unique0x100001f3 = status, UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return 0;
  }
  if ((destCapacity < 0) || ((0 < destCapacity && (dest == (UChar *)0x0)))) {
    *stack0xffffffffffffffc0 = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  keywordValueLen._0_1_ = 0;
  local_2c0 = uloc_getKeywordValue_63
                        (locale,keyword,(char *)&keywordValueLen,dispNameLen,stack0xffffffffffffffc0
                        );
  if (*stack0xffffffffffffffc0 == U_STRING_NOT_TERMINATED_WARNING) {
    *stack0xffffffffffffffc0 = U_BUFFER_OVERFLOW_ERROR;
  }
  iVar2 = uprv_stricmp_63(keyword,"currency");
  if (iVar2 != 0) {
    iVar3 = _getStringOrCopyKey("icudt63l-lang",displayLocale,"Types",keyword,
                                (char *)&keywordValueLen,(char *)&keywordValueLen,dest,destCapacity,
                                stack0xffffffffffffffc0);
    return iVar3;
  }
  dispName._4_4_ = 0;
  resB = ures_open_63("icudt63l-curr",displayLocale,stack0xffffffffffffffc0);
  resB_00 = ures_getByKey_63(resB,"Currencies",(UResourceBundle *)0x0,stack0xffffffffffffffc0);
  resB_01 = ures_getByKeyWithFallback_63
                      (resB_00,(char *)&keywordValueLen,(UResourceBundle *)0x0,
                       stack0xffffffffffffffc0);
  src = ures_getStringByIndex_63(resB_01,1,(int32_t *)((long)&dispName + 4),stack0xffffffffffffffc0)
  ;
  ures_close_63(resB_01);
  ures_close_63(resB_00);
  ures_close_63(resB);
  UVar1 = U_FAILURE(*stack0xffffffffffffffc0);
  if (UVar1 != '\0') {
    if (*stack0xffffffffffffffc0 != U_MISSING_RESOURCE_ERROR) {
      return 0;
    }
    *stack0xffffffffffffffc0 = U_USING_DEFAULT_WARNING;
  }
  if (src != (UChar *)0x0) {
    if (dispName._4_4_ <= destCapacity) {
      u_memcpy_63(dest,src,dispName._4_4_);
      iVar3 = u_terminateUChars_63(dest,destCapacity,dispName._4_4_,stack0xffffffffffffffc0);
      return iVar3;
    }
    *stack0xffffffffffffffc0 = U_BUFFER_OVERFLOW_ERROR;
    return dispName._4_4_;
  }
  if (local_2c0 <= destCapacity) {
    u_charsToUChars_63((char *)&keywordValueLen,dest,local_2c0);
    iVar3 = u_terminateUChars_63(dest,destCapacity,local_2c0,stack0xffffffffffffffc0);
    return iVar3;
  }
  *stack0xffffffffffffffc0 = U_BUFFER_OVERFLOW_ERROR;
  return local_2c0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayKeywordValue(   const char* locale,
                               const char* keyword,
                               const char* displayLocale,
                               UChar* dest,
                               int32_t destCapacity,
                               UErrorCode* status){


    char keywordValue[ULOC_FULLNAME_CAPACITY*4];
    int32_t capacity = ULOC_FULLNAME_CAPACITY*4;
    int32_t keywordValueLen =0;

    /* argument checking */
    if(status==NULL || U_FAILURE(*status)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* get the keyword value */
    keywordValue[0]=0;
    keywordValueLen = uloc_getKeywordValue(locale, keyword, keywordValue, capacity, status);
    if (*status == U_STRING_NOT_TERMINATED_WARNING)
      *status = U_BUFFER_OVERFLOW_ERROR;

    /* 
     * if the keyword is equal to currency .. then to get the display name 
     * we need to do the fallback ourselves
     */
    if(uprv_stricmp(keyword, _kCurrency)==0){

        int32_t dispNameLen = 0;
        const UChar *dispName = NULL;
        
        UResourceBundle *bundle     = ures_open(U_ICUDATA_CURR, displayLocale, status);
        UResourceBundle *currencies = ures_getByKey(bundle, _kCurrencies, NULL, status);
        UResourceBundle *currency   = ures_getByKeyWithFallback(currencies, keywordValue, NULL, status);
        
        dispName = ures_getStringByIndex(currency, UCURRENCY_DISPLAY_NAME_INDEX, &dispNameLen, status);
        
        /*close the bundles */
        ures_close(currency);
        ures_close(currencies);
        ures_close(bundle);
        
        if(U_FAILURE(*status)){
            if(*status == U_MISSING_RESOURCE_ERROR){
                /* we just want to write the value over if nothing is available */
                *status = U_USING_DEFAULT_WARNING;
            }else{
                return 0;
            }
        }

        /* now copy the dispName over if not NULL */
        if(dispName != NULL){
            if(dispNameLen <= destCapacity){
                u_memcpy(dest, dispName, dispNameLen);
                return u_terminateUChars(dest, destCapacity, dispNameLen, status);
            }else{
                *status = U_BUFFER_OVERFLOW_ERROR;
                return dispNameLen;
            }
        }else{
            /* we have not found the display name for the value .. just copy over */
            if(keywordValueLen <= destCapacity){
                u_charsToUChars(keywordValue, dest, keywordValueLen);
                return u_terminateUChars(dest, destCapacity, keywordValueLen, status);
            }else{
                 *status = U_BUFFER_OVERFLOW_ERROR;
                return keywordValueLen;
            }
        }

        
    }else{

        return _getStringOrCopyKey(U_ICUDATA_LANG, displayLocale,
                                   _kTypes, keyword, 
                                   keywordValue,
                                   keywordValue,
                                   dest, destCapacity,
                                   status);
    }
}